

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O3

IO __thiscall adios2::ADIOS::DeclareIO(ADIOS *this,string *name,ArrayOrdering ArrayOrder)

{
  element_type *peVar1;
  pointer pcVar2;
  long *plVar3;
  IO *io;
  size_type *psVar4;
  IO local_88;
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"for io name ",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_80.field_2._M_allocated_capacity = *psVar4;
    local_80.field_2._8_8_ = plVar3[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar4;
    local_80._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_80._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  CheckPointer(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + name->_M_string_length);
  io = (IO *)adios2::core::ADIOS::DeclareIO(peVar1,(string *)local_60,ArrayOrder);
  IO::IO(&local_88,io);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return (IO)local_88.m_IO;
}

Assistant:

IO ADIOS::DeclareIO(const std::string name, const ArrayOrdering ArrayOrder)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::DeclareIO");
    return IO(&m_ADIOS->DeclareIO(name, ArrayOrder));
}